

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_nix.c
# Opt level: O2

int katherine_udp_init(katherine_udp_t *u,uint16_t param_2,char *remote_addr,uint16_t remote_port,
                      uint32_t timeout_ms)

{
  int iVar1;
  int *piVar2;
  timeval timeout;
  
  iVar1 = socket(2,2,0x11);
  u->sock = iVar1;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    return *piVar2;
  }
  (u->addr_local).sin_family = 2;
  (u->addr_local).sin_port = param_2 << 8 | param_2 >> 8;
  (u->addr_local).sin_addr.s_addr = 0;
  iVar1 = bind(iVar1,(sockaddr *)&u->addr_local,0x10);
  if (iVar1 == -1) {
LAB_00104241:
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  else {
    if (timeout_ms != 0) {
      timeout.tv_sec = (ulong)timeout_ms / 1000;
      timeout.tv_usec = (__suseconds_t)((timeout_ms % 1000) * 1000);
      iVar1 = setsockopt(u->sock,1,0x14,&timeout,0x10);
      if (iVar1 == -1) goto LAB_00104241;
    }
    (u->addr_remote).sin_family = 2;
    (u->addr_remote).sin_port = remote_port << 8 | remote_port >> 8;
    iVar1 = inet_pton(2,remote_addr,&(u->addr_remote).sin_addr);
    if (iVar1 < 1) {
      iVar1 = 0x16;
    }
    else {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&u->mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  close(u->sock);
  return iVar1;
}

Assistant:

int
katherine_udp_init(katherine_udp_t *u, uint16_t local_port, const char *remote_addr, uint16_t remote_port, uint32_t timeout_ms)
{
    int res = 0;

    // Create socket.
    if ((u->sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) == -1) {
        res = errno;
        goto err_socket;
    }

    // Setup and bind the socket address.
    u->addr_local.sin_family = AF_INET;
    u->addr_local.sin_port = htons(local_port);
    u->addr_local.sin_addr.s_addr = htonl(INADDR_ANY);

    if (bind(u->sock, (struct sockaddr*) &u->addr_local, sizeof(u->addr_local)) == -1) {
        res = errno;
        goto err_bind;
    }

    if (timeout_ms > 0) {
        // Set socket timeout.
        struct timeval timeout;
        timeout.tv_sec = timeout_ms / 1000;
        timeout.tv_usec = 1000 * (timeout_ms % 1000);
        if (setsockopt(u->sock, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout)) == -1) {
            res = errno;
            goto err_timeout;
        }
    }

    // Set remote socket address.
    u->addr_remote.sin_family = AF_INET;
    u->addr_remote.sin_port = htons(remote_port);
    if (inet_pton(AF_INET, remote_addr, &u->addr_remote.sin_addr) <= 0) {
        res = EINVAL;
        goto err_remote;
    }

    if ((res = pthread_mutex_init(&u->mutex, NULL)) != 0) {
        goto err_mutex;
    }

    return res;

err_mutex:
err_remote:
err_timeout:
err_bind:
    close(u->sock);
err_socket:
    return res;
}